

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# combine_access_chains.cpp
# Opt level: O0

uint32_t __thiscall
spvtools::opt::CombineAccessChains::GetConstantValue
          (CombineAccessChains *this,Constant *constant_inst)

{
  bool bVar1;
  int iVar2;
  uint32_t uVar3;
  Type *pTVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Constant *constant_inst_local;
  CombineAccessChains *this_local;
  
  pTVar4 = analysis::Constant::type(constant_inst);
  iVar2 = (*pTVar4->_vptr_Type[10])();
  uVar3 = analysis::Integer::width((Integer *)CONCAT44(extraout_var,iVar2));
  if (uVar3 < 0x21) {
    pTVar4 = analysis::Constant::type(constant_inst);
    iVar2 = (*pTVar4->_vptr_Type[10])();
    bVar1 = analysis::Integer::IsSigned((Integer *)CONCAT44(extraout_var_00,iVar2));
    if (bVar1) {
      this_local._4_4_ = analysis::Constant::GetS32(constant_inst);
    }
    else {
      this_local._4_4_ = analysis::Constant::GetU32(constant_inst);
    }
    return this_local._4_4_;
  }
  __assert_fail("false",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/combine_access_chains.cpp"
                ,0x47,
                "uint32_t spvtools::opt::CombineAccessChains::GetConstantValue(const analysis::Constant *)"
               );
}

Assistant:

uint32_t CombineAccessChains::GetConstantValue(
    const analysis::Constant* constant_inst) {
  if (constant_inst->type()->AsInteger()->width() <= 32) {
    if (constant_inst->type()->AsInteger()->IsSigned()) {
      return static_cast<uint32_t>(constant_inst->GetS32());
    } else {
      return constant_inst->GetU32();
    }
  } else {
    assert(false);
    return 0u;
  }
}